

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O0

void __thiscall TTD::SnapShot::Inflate(SnapShot *this,InflateMap *inflator,ThreadContextTTD *tCtx)

{
  unsigned_long uVar1;
  bool bVar2;
  uint32 uVar3;
  charcount_t len;
  FunctionBodyResolveInfo *pFVar4;
  SlotArrayInfo *slotInfo;
  ScriptFunctionScopeInfo *funcScopeInfo;
  SnapObject *pSVar5;
  RecyclableObject *obj;
  DynamicObject *obj_00;
  SnapContext *snpCtx_00;
  ScriptContext *intoCtx;
  ThreadContext *pTVar6;
  int *piVar7;
  Recycler *pRVar8;
  HashedCharacterBuffer<char16_t> *this_00;
  char16 *string;
  TrackAllocData local_2b8;
  HashedCharacterBuffer<char16_t> *local_290;
  HashedCharacterBuffer<char16_t> *propertyName;
  PropertyRecord *pRecord;
  undefined1 local_278 [4];
  PropertyId pid;
  Iterator iter_9;
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *tcSymbolRegistrationMap;
  ScriptContext *sctx;
  SnapContext *snpCtx;
  Iterator iter_8;
  fPtr_DoAddtlValueInstantiation addtlInstFPtr;
  RecyclableObject *iobj;
  SnapObject *sobj;
  Iterator iter_7;
  FrameDisplay *frame;
  ScriptFunctionScopeInfo *sfsi;
  Iterator iter_6;
  Type *slots;
  SlotArrayInfo *sai;
  Iterator iter_5;
  SnapObject *sObj;
  Iterator iter_4;
  SnapPrimitiveValue *pSnap;
  Iterator iter_3;
  FunctionBodyResolveInfo *fbInfo;
  Iterator iter_2;
  undefined1 local_c8 [8];
  Iterator iter_1;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> idToSnpObjectMap;
  undefined1 local_78 [8];
  Iterator iter;
  undefined1 local_40 [8];
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
  idToSnpBodyMap;
  ThreadContextTTD *tCtx_local;
  InflateMap *inflator_local;
  SnapShot *this_local;
  
  idToSnpBodyMap._24_8_ = tCtx;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>::
  TTDIdentifierDictionary
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*> *
             )local_40);
  uVar3 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Count
                    (&this->m_functionBodyList);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>::Initialize
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*> *
             )local_40,uVar3);
  UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::GetIterator
            ((Iterator *)local_78,&this->m_functionBodyList);
  while (bVar2 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::
                 IsValid((Iterator *)local_78), bVar2) {
    pFVar4 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::
             Current((Iterator *)local_78);
    uVar1 = pFVar4->FunctionBodyId;
    idToSnpObjectMap._24_8_ =
         UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::Current
                   ((Iterator *)local_78);
    TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>::AddItem
              ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
                *)local_40,uVar1,(FunctionBodyResolveInfo **)&idToSnpObjectMap.m_count);
    UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::MoveNext
              ((Iterator *)local_78);
  }
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>::TTDIdentifierDictionary
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> *)
             &iter_1.m_currEntry);
  uVar3 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                    (&this->m_compoundObjectList);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>::Initialize
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> *)
             &iter_1.m_currEntry,uVar3);
  UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::GetIterator
            ((Iterator *)local_c8,&this->m_compoundObjectList);
  while (bVar2 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::IsValid
                           ((Iterator *)local_c8), bVar2) {
    pSVar5 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::Current
                       ((Iterator *)local_c8);
    uVar1 = pSVar5->ObjectPtrId;
    iter_2.m_currEntry =
         (FunctionBodyResolveInfo *)
         UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::Current
                   ((Iterator *)local_c8);
    TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>::AddItem
              ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> *)
               &iter_1.m_currEntry,uVar1,(SnapObject **)&iter_2.m_currEntry);
    UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::MoveNext
              ((Iterator *)local_c8);
  }
  UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::GetIterator
            ((Iterator *)&fbInfo,&this->m_functionBodyList);
  while (bVar2 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::
                 IsValid((Iterator *)&fbInfo), bVar2) {
    iter_3.m_currEntry =
         (SnapPrimitiveValue *)
         UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::Current
                   ((Iterator *)&fbInfo);
    NSSnapValues::InflateFunctionBody
              ((FunctionBodyResolveInfo *)iter_3.m_currEntry,inflator,
               (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
                *)local_40);
    UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::MoveNext
              ((Iterator *)&fbInfo);
  }
  UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::GetIterator
            ((Iterator *)&pSnap,&this->m_primitiveObjectList);
  while (bVar2 = UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::Iterator::
                 IsValid((Iterator *)&pSnap), bVar2) {
    iter_4.m_currEntry =
         (SnapObject *)
         UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::Iterator::Current
                   ((Iterator *)&pSnap);
    NSSnapValues::InflateSnapPrimitiveValue((SnapPrimitiveValue *)iter_4.m_currEntry,inflator);
    UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::Iterator::MoveNext
              ((Iterator *)&pSnap);
  }
  UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::GetIterator
            ((Iterator *)&sObj,&this->m_compoundObjectList);
  while (bVar2 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::IsValid
                           ((Iterator *)&sObj), bVar2) {
    iter_5.m_currEntry =
         (SlotArrayInfo *)
         UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::Current
                   ((Iterator *)&sObj);
    InflateSingleObject(this,(SnapObject *)iter_5.m_currEntry,inflator,
                        (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> *)
                        &iter_1.m_currEntry);
    UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::MoveNext
              ((Iterator *)&sObj);
  }
  UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::GetIterator
            ((Iterator *)&sai,&this->m_slotArrayEntries);
  while (bVar2 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Iterator::IsValid
                           ((Iterator *)&sai), bVar2) {
    slotInfo = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Iterator::Current
                         ((Iterator *)&sai);
    iter_6.m_currEntry =
         (ScriptFunctionScopeInfo *)NSSnapValues::InflateSlotArrayInfo(slotInfo,inflator);
    InflateMap::AddSlotArray(inflator,slotInfo->SlotId,(Type *)iter_6.m_currEntry);
    UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Iterator::MoveNext
              ((Iterator *)&sai);
  }
  UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::GetIterator
            ((Iterator *)&sfsi,&this->m_scopeEntries);
  while (bVar2 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::
                 IsValid((Iterator *)&sfsi), bVar2) {
    funcScopeInfo =
         UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::Current
                   ((Iterator *)&sfsi);
    iter_7.m_currEntry =
         (SnapObject *)NSSnapValues::InflateScriptFunctionScopeInfo(funcScopeInfo,inflator);
    InflateMap::AddEnvironment(inflator,funcScopeInfo->ScopeId,(FrameDisplay *)iter_7.m_currEntry);
    UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::MoveNext
              ((Iterator *)&sfsi);
  }
  UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::GetIterator
            ((Iterator *)&sobj,&this->m_compoundObjectList);
  while (bVar2 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::IsValid
                           ((Iterator *)&sobj), bVar2) {
    pSVar5 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::Current
                       ((Iterator *)&sobj);
    obj = InflateMap::LookupObject(inflator,pSVar5->ObjectPtrId);
    iter_8.m_currEntry =
         (SnapContext *)this->m_snapObjectVTableArray[pSVar5->SnapObjectTag].AddtlInstationationFunc
    ;
    if (iter_8.m_currEntry != (SnapContext *)0x0) {
      (*(code *)iter_8.m_currEntry)(pSVar5,obj,inflator);
    }
    bVar2 = Js::DynamicType::Is(pSVar5->SnapType->JsTypeId);
    if (bVar2) {
      obj_00 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
      NSSnapObjects::StdPropertyRestore(pSVar5,obj_00,inflator);
    }
    UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::MoveNext
              ((Iterator *)&sobj);
  }
  ReLinkThreadContextInfo(this,inflator,(ThreadContextTTD *)idToSnpBodyMap._24_8_);
  UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::GetIterator
            ((Iterator *)&snpCtx,&this->m_ctxList);
  while (bVar2 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::IsValid
                           ((Iterator *)&snpCtx), bVar2) {
    snpCtx_00 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::Current
                          ((Iterator *)&snpCtx);
    intoCtx = InflateMap::LookupScriptContext(inflator,snpCtx_00->ScriptContextLogId);
    NSSnapValues::ResetPendingAsyncBufferModInfo(snpCtx_00,intoCtx,inflator);
    UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::MoveNext
              ((Iterator *)&snpCtx);
  }
  pTVar6 = ThreadContextTTD::GetThreadContext((ThreadContextTTD *)idToSnpBodyMap._24_8_);
  iter_9.m_currEntry = (int *)ThreadContext::GetSymbolRegistrationMap_TTD(pTVar6);
  JsUtil::
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear((BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *)iter_9.m_currEntry);
  UnorderedArrayList<int,_32UL>::GetIterator
            ((Iterator *)local_278,&this->m_tcSymbolRegistrationMapContents);
  while (bVar2 = UnorderedArrayList<int,_32UL>::Iterator::IsValid((Iterator *)local_278), bVar2) {
    piVar7 = UnorderedArrayList<int,_32UL>::Iterator::Current((Iterator *)local_278);
    pRecord._4_4_ = *piVar7;
    pTVar6 = ThreadContextTTD::GetThreadContext((ThreadContextTTD *)idToSnpBodyMap._24_8_);
    propertyName = (HashedCharacterBuffer<char16_t> *)
                   ThreadContext::GetPropertyName(pTVar6,pRecord._4_4_);
    pTVar6 = ThreadContextTTD::GetThreadContext((ThreadContextTTD *)idToSnpBodyMap._24_8_);
    pRVar8 = ThreadContext::GetRecycler(pTVar6);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_2b8,(type_info *)&Js::HashedCharacterBuffer<char16_t>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTSnapshot.cpp"
               ,0x275);
    pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_2b8);
    this_00 = (HashedCharacterBuffer<char16_t> *)new<Memory::Recycler>(0x10,pRVar8,0x43c4b0);
    string = Js::PropertyRecord::GetBuffer((PropertyRecord *)propertyName);
    len = Js::PropertyRecord::GetLength((PropertyRecord *)propertyName);
    Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer(this_00,string,len);
    local_290 = this_00;
    JsUtil::
    BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add((BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *)iter_9.m_currEntry,&local_290,(PropertyRecord **)&propertyName);
    UnorderedArrayList<int,_32UL>::Iterator::MoveNext((Iterator *)local_278);
  }
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>::~TTDIdentifierDictionary
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> *)
             &iter_1.m_currEntry);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>::
  ~TTDIdentifierDictionary
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*> *
             )local_40);
  return;
}

Assistant:

void SnapShot::Inflate(InflateMap* inflator, ThreadContextTTD* tCtx) const
    {
        //We assume the caller has inflated all of the ScriptContexts for us and we are just filling in the objects

        ////

        //set the map from all function body ids to their snap representations
        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapValues::FunctionBodyResolveInfo*> idToSnpBodyMap;
        idToSnpBodyMap.Initialize(this->m_functionBodyList.Count());

        for(auto iter = this->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            idToSnpBodyMap.AddItem(iter.Current()->FunctionBodyId, iter.Current());
        }

        //set the map from all compound object ids to their snap representations
        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapObjects::SnapObject*> idToSnpObjectMap;
        idToSnpObjectMap.Initialize(this->m_compoundObjectList.Count());

        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            idToSnpObjectMap.AddItem(iter.Current()->ObjectPtrId, iter.Current());
        }

        ////

        //inflate all the function bodies
        for(auto iter = this->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::FunctionBodyResolveInfo* fbInfo = iter.Current();
            NSSnapValues::InflateFunctionBody(fbInfo, inflator, idToSnpBodyMap);
        }

        //inflate all the primitive objects
        for(auto iter = this->m_primitiveObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapPrimitiveValue* pSnap = iter.Current();
            NSSnapValues::InflateSnapPrimitiveValue(pSnap, inflator);
        }

        //inflate all the regular objects
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapObjects::SnapObject* sObj = iter.Current();
            this->InflateSingleObject(sObj, inflator, idToSnpObjectMap);
        }

        //take care of all the slot arrays
        for(auto iter = this->m_slotArrayEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SlotArrayInfo* sai = iter.Current();
            Field(Js::Var)* slots = NSSnapValues::InflateSlotArrayInfo(sai, inflator);

            inflator->AddSlotArray(sai->SlotId, slots);
        }

        //and the scope entries
        for(auto iter = this->m_scopeEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::ScriptFunctionScopeInfo* sfsi = iter.Current();
            Js::FrameDisplay* frame = NSSnapValues::InflateScriptFunctionScopeInfo(sfsi, inflator);

            inflator->AddEnvironment(sfsi->ScopeId, frame);
        }

        //Link up the object pointers
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapObjects::SnapObject* sobj = iter.Current();
            Js::RecyclableObject* iobj = inflator->LookupObject(sobj->ObjectPtrId);

            NSSnapObjects::fPtr_DoAddtlValueInstantiation addtlInstFPtr = this->m_snapObjectVTableArray[(uint32)sobj->SnapObjectTag].AddtlInstationationFunc;
            if(addtlInstFPtr != nullptr)
            {
                addtlInstFPtr(sobj, iobj, inflator);
            }

            if(Js::DynamicType::Is(sobj->SnapType->JsTypeId))
            {
                NSSnapObjects::StdPropertyRestore(sobj, Js::VarTo<Js::DynamicObject>(iobj), inflator);
            }
        }

        this->ReLinkThreadContextInfo(inflator, tCtx);

        for(auto iter = this->m_ctxList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapContext* snpCtx = iter.Current();
            Js::ScriptContext* sctx = inflator->LookupScriptContext(snpCtx->ScriptContextLogId);

            NSSnapValues::ResetPendingAsyncBufferModInfo(snpCtx, sctx, inflator);
        }

        //reset the threadContext symbol map
        JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16>*, const Js::PropertyRecord*, Recycler, PowerOf2SizePolicy, Js::PropertyRecordStringHashComparer>* tcSymbolRegistrationMap = tCtx->GetThreadContext()->GetSymbolRegistrationMap_TTD();
        tcSymbolRegistrationMap->Clear();

        for(auto iter = this->m_tcSymbolRegistrationMapContents.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            Js::PropertyId pid = *iter.Current();
            const Js::PropertyRecord* pRecord = tCtx->GetThreadContext()->GetPropertyName(pid);
            Js::HashedCharacterBuffer<char16> * propertyName = RecyclerNew(tCtx->GetThreadContext()->GetRecycler(), Js::HashedCharacterBuffer<char16>, pRecord->GetBuffer(), pRecord->GetLength());

            tcSymbolRegistrationMap->Add(propertyName, pRecord);
        }
    }